

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t
exr_attr_list_remove(exr_context_t ctxt,exr_attribute_list_t *list,exr_attribute_t *attr)

{
  int iVar1;
  long lVar2;
  _internal_exr_context *ctxt_00;
  long in_RDX;
  int *in_RSI;
  exr_attribute_t *in_RDI;
  int i_2;
  int i_1;
  int i;
  _internal_exr_context *pctxt;
  exr_attribute_t **attrs;
  int attridx;
  int cattrsz;
  int local_44;
  int local_40;
  int local_3c;
  int local_28;
  exr_result_t local_4;
  
  local_28 = -1;
  if (in_RDI == (exr_attribute_t *)0x0) {
    local_4 = 2;
  }
  else if (in_RDX == 0) {
    local_4 = (*(code *)in_RDI[2].name)(in_RDI,3,"NULL attribute passed to remove");
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = (*(code *)in_RDI[2].name)(in_RDI,3,"Invalid list pointer to remove attribute");
  }
  else {
    iVar1 = *in_RSI;
    lVar2 = *(long *)(in_RSI + 2);
    for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
      if (*(long *)(lVar2 + (long)local_3c * 8) == in_RDX) {
        local_28 = local_3c;
        break;
      }
    }
    if (local_28 == -1) {
      local_4 = (*(code *)in_RDI[2].name)(in_RDI,3,"Attribute not in list");
    }
    else {
      *(undefined8 *)(*(long *)(in_RSI + 2) + (long)local_28 * 8) = 0;
      for (local_40 = local_28; local_40 < iVar1 + -1; local_40 = local_40 + 1) {
        *(undefined8 *)(lVar2 + (long)local_40 * 8) =
             *(undefined8 *)(lVar2 + (long)(local_40 + 1) * 8);
      }
      *in_RSI = iVar1 + -1;
      ctxt_00 = *(_internal_exr_context **)(in_RSI + 4);
      local_28 = 0;
      for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
        if (*(long *)(&ctxt_00->mode + (long)local_44 * 8) != in_RDX) {
          *(undefined8 *)(&ctxt_00->mode + (long)local_28 * 8) =
               *(undefined8 *)(&ctxt_00->mode + (long)local_44 * 8);
          local_28 = local_28 + 1;
        }
      }
      local_4 = attr_destroy(ctxt_00,in_RDI);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_list_remove (
    exr_context_t ctxt, exr_attribute_list_t* list, exr_attribute_t* attr)
{
    int               cattrsz, attridx = -1;
    exr_attribute_t** attrs;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!attr)
    {
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "NULL attribute passed to remove");
    }

    if (!list)
    {
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid list pointer to remove attribute");
    }

    cattrsz = list->num_attributes;
    attrs   = list->entries;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr)
        {
            attridx = i;
            break;
        }
    }

    if (attridx == -1)
    {
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Attribute not in list");
    }

    list->entries[attridx] = NULL;
    for (int i = attridx; i < (cattrsz - 1); ++i)
        attrs[i] = attrs[i + 1];
    list->num_attributes = cattrsz - 1;

    attrs   = list->sorted_entries;
    attridx = 0;
    for (int i = 0; i < cattrsz; ++i)
    {
        if (attrs[i] == attr) continue;
        attrs[attridx++] = attrs[i];
    }

    return attr_destroy (pctxt, attr);
}